

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<double>::apply
          (QControlledGate2<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,
          int offset)

{
  double dVar1;
  double dVar2;
  int iVar3;
  QControlledGate2<double> *pQVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  long lVar8;
  double *pdVar9;
  long lVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  char *__assertion;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  vector<int,_std::allocator<int>_> qubits;
  long local_a8;
  long local_a0;
  long local_80;
  double *local_78;
  QControlledGate2<double> *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int *local_48 [2];
  long local_38;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[5])(local_48,this);
  iVar5 = *local_48[0];
  *local_48[0] = iVar5 + offset;
  iVar6 = local_48[0][1];
  local_48[0][1] = offset + iVar6;
  if (iVar5 + offset < nbQubits) {
    if (offset + iVar6 < nbQubits) {
      local_70 = this;
      iVar5 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x10])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))(&local_80);
      pQVar4 = local_70;
      if ((op != NoTrans) && (1 < local_80)) {
        pdVar13 = local_78 + local_80;
        pdVar9 = local_78;
        lVar8 = 0;
        do {
          lVar20 = 1;
          pdVar12 = pdVar13;
          do {
            dVar1 = pdVar9[lVar20];
            pdVar9[lVar20] = *pdVar12;
            *pdVar12 = dVar1;
            lVar17 = lVar8 + lVar20;
            lVar20 = lVar20 + 1;
            pdVar12 = pdVar12 + local_80;
          } while (lVar17 + 1 < local_80);
          pdVar13 = pdVar13 + local_80 + 1;
          pdVar9 = pdVar9 + local_80 + 1;
          bVar22 = lVar8 != local_80 + -2;
          lVar8 = lVar8 + 1;
        } while (bVar22);
      }
      iVar5 = local_70->control_;
      iVar6 = (*(local_70->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(local_70)
      ;
      if (iVar5 < iVar6) {
        iVar5 = (*(pQVar4->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar4);
        iVar11 = 1 << ((char)iVar5 - (char)pQVar4->control_ & 0x1fU);
        iVar5 = (*(pQVar4->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar4);
        uVar7 = (*(pQVar4->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar4);
        lVar8 = (long)iVar11;
        iVar6 = ~uVar7 + nbQubits;
        lVar20 = (long)(1 << ((byte)iVar5 & 0x1f));
        lVar17 = (long)(1 << ((byte)iVar6 & 0x1f));
        local_60 = matrix->size_;
        if (side == Left) {
          if (0 < local_60) {
            iVar3 = local_70->controlState_;
            lVar18 = 1;
            if (1 < lVar17) {
              lVar18 = lVar17;
            }
            lVar19 = 1;
            if (1 < lVar20) {
              lVar19 = lVar20;
            }
            lVar21 = 0;
            lVar20 = 0;
            do {
              if (iVar5 != 0x1f) {
                pdVar13 = (matrix->data_)._M_t.
                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                          super__Head_base<0UL,_double_*,_false>._M_head_impl;
                lVar16 = lVar17 * local_60 * 8 + lVar21;
                lVar14 = 0;
                do {
                  if (iVar3 == 1) {
                    if ((long)(iVar11 / 2) <= lVar14 % lVar8) goto LAB_0011444b;
                  }
                  else if ((iVar3 != 0) || (lVar14 % lVar8 < (long)(iVar11 / 2))) {
LAB_0011444b:
                    pdVar9 = pdVar13;
                    lVar10 = lVar18;
                    if (iVar6 != 0x1f) {
                      do {
                        dVar1 = *(double *)((long)pdVar9 + lVar21);
                        dVar2 = *(double *)((long)pdVar9 + lVar16);
                        *(double *)((long)pdVar9 + lVar21) = *local_78 * dVar1 + local_78[1] * dVar2
                        ;
                        *(double *)((long)pdVar9 + lVar16) =
                             dVar1 * local_78[local_80] + dVar2 * local_78[local_80 + 1];
                        lVar10 = lVar10 + -1;
                        pdVar9 = pdVar9 + local_60;
                      } while (lVar10 != 0);
                    }
                  }
                  lVar14 = lVar14 + 1;
                  pdVar13 = pdVar13 + lVar17 * local_60 * 2;
                } while (lVar14 != lVar19);
              }
              lVar20 = lVar20 + 1;
              lVar21 = lVar21 + 8;
            } while (lVar20 != local_60);
          }
        }
        else if (0 < local_60) {
          iVar3 = local_70->controlState_;
          lVar18 = 1;
          if (1 < lVar17) {
            lVar18 = lVar17;
          }
          lVar19 = 1;
          if (1 < lVar20) {
            lVar19 = lVar20;
          }
          local_a8 = lVar17 * 8;
          local_a0 = 0;
          lVar20 = 0;
          do {
            if (iVar5 != 0x1f) {
              pdVar13 = (matrix->data_)._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl;
              lVar21 = local_a8 + (long)pdVar13;
              lVar14 = (long)pdVar13 + local_a0;
              lVar16 = 0;
              do {
                if (iVar3 == 1) {
                  if ((long)(iVar11 / 2) <= lVar16 % lVar8) goto LAB_00114870;
                }
                else if ((iVar3 != 0) || (lVar16 % lVar8 < (long)(iVar11 / 2))) {
LAB_00114870:
                  if (iVar6 != 0x1f) {
                    lVar10 = 0;
                    do {
                      dVar1 = *(double *)(lVar14 + lVar10 * 8);
                      dVar2 = *(double *)(lVar21 + lVar10 * 8);
                      *(double *)(lVar14 + lVar10 * 8) =
                           *local_78 * dVar1 + local_78[local_80] * dVar2;
                      *(double *)(lVar21 + lVar10 * 8) =
                           dVar1 * local_78[1] + dVar2 * local_78[local_80 + 1];
                      lVar10 = lVar10 + 1;
                    } while (lVar18 != lVar10);
                  }
                }
                lVar16 = lVar16 + 1;
                lVar21 = lVar21 + lVar17 * 0x10;
                lVar14 = lVar14 + lVar17 * 0x10;
              } while (lVar16 != lVar19);
            }
            lVar20 = lVar20 + 1;
            local_a8 = local_a8 + local_60 * 8;
            local_a0 = local_a0 + local_60 * 8;
          } while (lVar20 != local_60);
        }
      }
      else {
        iVar6 = 1 << ((byte)nbQubits - (char)pQVar4->control_ & 0x1f);
        iVar5 = (*(pQVar4->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar4);
        uVar7 = (*(pQVar4->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar4);
        local_60 = CONCAT44(local_60._4_4_,iVar5);
        lVar17 = (long)iVar6;
        iVar11 = ~uVar7 + nbQubits;
        lVar20 = (long)(1 << ((byte)iVar5 & 0x1f));
        lVar18 = (long)(1 << ((byte)iVar11 & 0x1f));
        lVar8 = matrix->size_;
        if (side == Left) {
          if (0 < lVar8) {
            lVar19 = 1;
            if (1 < lVar18) {
              lVar19 = lVar18;
            }
            lVar21 = 1;
            if (1 < lVar20) {
              lVar21 = lVar20;
            }
            local_68 = 0;
            lVar20 = 0;
            do {
              local_58 = lVar20;
              if (iVar5 != 0x1f) {
                iVar3 = local_70->controlState_;
                lVar16 = 0;
                lVar20 = local_68;
                do {
                  if (iVar11 != 0x1f) {
                    pdVar13 = (matrix->data_)._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl;
                    lVar14 = lVar18 * lVar8 * 8 + lVar20;
                    lVar10 = 0;
                    do {
                      if (iVar3 == 1) {
                        if ((long)(iVar6 / 2) <= lVar10 % lVar17) goto LAB_0011460f;
                      }
                      else if ((iVar3 != 0) || (lVar10 % lVar17 < (long)(iVar6 / 2))) {
LAB_0011460f:
                        dVar1 = *(double *)((long)pdVar13 + lVar20);
                        dVar2 = *(double *)((long)pdVar13 + lVar14);
                        *(double *)((long)pdVar13 + lVar20) =
                             *local_78 * dVar1 + local_78[1] * dVar2;
                        *(double *)((long)pdVar13 + lVar14) =
                             dVar1 * local_78[local_80] + dVar2 * local_78[local_80 + 1];
                      }
                      lVar10 = lVar10 + 1;
                      pdVar13 = pdVar13 + lVar8;
                    } while (lVar19 != lVar10);
                  }
                  lVar16 = lVar16 + 1;
                  lVar20 = lVar20 + lVar18 * lVar8 * 0x10;
                } while (lVar16 != lVar21);
              }
              local_68 = local_68 + 8;
              lVar20 = local_58 + 1;
            } while (local_58 + 1 != lVar8);
          }
        }
        else if (0 < lVar8) {
          lVar19 = 1;
          if (1 < lVar18) {
            lVar19 = lVar18;
          }
          lVar21 = 1;
          if (1 < lVar20) {
            lVar21 = lVar20;
          }
          local_58 = lVar18 * 8;
          local_50 = lVar8 * 8;
          local_68 = 0;
          lVar20 = 0;
          do {
            if (iVar5 != 0x1f) {
              iVar3 = local_70->controlState_;
              lVar10 = 0;
              lVar16 = local_58;
              lVar14 = local_68;
              do {
                if (iVar11 != 0x1f) {
                  pdVar13 = (matrix->data_)._M_t.
                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl;
                  lVar15 = 0;
                  do {
                    if (iVar3 == 1) {
                      if ((long)(iVar6 / 2) <= lVar15 % lVar17) goto LAB_00114760;
                    }
                    else if ((iVar3 != 0) || (lVar15 % lVar17 < (long)(iVar6 / 2))) {
LAB_00114760:
                      dVar1 = *(double *)((long)pdVar13 + lVar15 * 8 + lVar14);
                      dVar2 = *(double *)((long)pdVar13 + lVar15 * 8 + lVar16);
                      *(double *)((long)pdVar13 + lVar15 * 8 + lVar14) =
                           *local_78 * dVar1 + local_78[local_80] * dVar2;
                      *(double *)((long)pdVar13 + lVar15 * 8 + lVar16) =
                           dVar1 * local_78[1] + dVar2 * local_78[local_80 + 1];
                    }
                    lVar15 = lVar15 + 1;
                  } while (lVar19 != lVar15);
                }
                lVar10 = lVar10 + 1;
                lVar16 = lVar16 + lVar18 * 0x10;
                lVar14 = lVar14 + lVar18 * 0x10;
              } while (lVar10 != lVar21);
            }
            lVar20 = lVar20 + 1;
            local_58 = local_58 + local_50;
            local_68 = local_68 + local_50;
          } while (lVar20 != lVar8);
        }
      }
      if (local_78 != (double *)0x0) {
        operator_delete__(local_78);
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                ,0x33,
                "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }